

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_vc.c
# Opt level: O1

_Bool svc_vc_rendezvous_control(SVCXPRT *xprt,u_int rq,void *in)

{
  if ((int)rq < 0xf) {
    if (rq == 3) {
      *(undefined4 *)in = *(undefined4 *)(xprt[2].xp_local.ss.__ss_padding + 0x16);
    }
    else {
      if (rq != 4) {
        return false;
      }
      *(long *)(xprt[2].xp_local.ss.__ss_padding + 0x16) = (long)*in;
    }
  }
  else {
    if (rq == 0xf) {
      pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
      *(svc_xprt_fun_t *)in = xprt->xp_ops->xp_free_user_data;
    }
    else {
      if (rq != 0x10) {
        return false;
      }
      pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
      xprt->xp_ops->xp_free_user_data = (svc_xprt_fun_t)in;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&ops_lock);
  }
  return true;
}

Assistant:

static bool
svc_vc_rendezvous_control(SVCXPRT *xprt, const u_int rq, void *in)
{
	struct svc_vc_xprt *xd = VC_DR(REC_XPRT(xprt));

	switch (rq) {
	case SVCGET_CONNMAXREC:
		*(int *)in = xd->sx_dr.maxrec;
		break;
	case SVCSET_CONNMAXREC:
		xd->sx_dr.maxrec = *(int *)in;
		break;
	case SVCGET_XP_FREE_USER_DATA:
		mutex_lock(&ops_lock);
		*(svc_xprt_fun_t *) in = xprt->xp_ops->xp_free_user_data;
		mutex_unlock(&ops_lock);
		break;
	case SVCSET_XP_FREE_USER_DATA:
		mutex_lock(&ops_lock);
		xprt->xp_ops->xp_free_user_data = *(svc_xprt_fun_t) in;
		mutex_unlock(&ops_lock);
		break;
	default:
		return (FALSE);
	}
	return (TRUE);
}